

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

float deqp::gles2::Performance::vectorFloatMedian<long>(vector<long,_std::allocator<long>_> *v)

{
  long lVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  reference pvVar3;
  float local_54;
  undefined1 local_28 [8];
  vector<long,_std::allocator<long>_> temp;
  vector<long,_std::allocator<long>_> *v_local;
  
  temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)v;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_28,v);
  __first = std::vector<long,_std::allocator<long>_>::begin
                      ((vector<long,_std::allocator<long>_> *)local_28);
  __last = std::vector<long,_std::allocator<long>_>::end
                     ((vector<long,_std::allocator<long>_> *)local_28);
  std::sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             __first._M_current,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)__last._M_current
            );
  sVar2 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)local_28);
  if ((sVar2 & 1) == 0) {
    sVar2 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)local_28);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_28,(sVar2 >> 1) - 1);
    lVar1 = *pvVar3;
    sVar2 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)local_28);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_28,sVar2 >> 1);
    local_54 = ((float)lVar1 + (float)*pvVar3) * 0.5;
  }
  else {
    sVar2 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)local_28);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)local_28,sVar2 >> 1);
    local_54 = (float)*pvVar3;
  }
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_28)
  ;
  return local_54;
}

Assistant:

static float vectorFloatMedian (const vector<T>& v)
{
	DE_ASSERT(!v.empty());
	vector<T> temp = v;
	std::sort(temp.begin(), temp.end());
	return temp.size() % 2 == 0
		   ? 0.5f * ((float)temp[temp.size()/2-1] + (float)temp[temp.size()/2])
		   : (float)temp[temp.size()/2];
}